

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_io.c
# Opt level: O2

void uo_io_write_async(int wfd,void *buf,size_t len,uo_cb *cb)

{
  int iVar1;
  int *piVar2;
  epoll_event *__event;
  void *item;
  
  if (buf == (void *)0x0 || len == 0) {
    item = (void *)0x0;
  }
  else {
    piVar2 = (int *)malloc(0x20);
    *piVar2 = wfd;
    *(void **)(piVar2 + 2) = buf;
    *(size_t *)(piVar2 + 4) = len;
    *(uo_cb **)(piVar2 + 6) = cb;
    __event = (epoll_event *)malloc(0xc);
    __event->events = 0x40000004;
    *(int **)&__event->field_0x4 = piVar2;
    uo_cb_stack_push(cb,__event);
    iVar1 = epoll_ctl(epfd,1,wfd,__event);
    if (iVar1 == 0) {
      return;
    }
    piVar2 = __errno_location();
    if ((*piVar2 == 0x11) && (iVar1 = epoll_ctl(epfd,3,wfd,__event), iVar1 == 0)) {
      return;
    }
    item = (void *)0x1;
  }
  uo_cb_stack_push(cb,item);
  uo_cb_stack_push(cb,(void *)0x0);
  uo_cb_invoke_async(cb);
  return;
}

Assistant:

void uo_io_write_async(
    int wfd,
    void *buf,
    size_t len,
    uo_cb *cb)
{
    if (!buf || !len)
    {
        uo_cb_stack_push(cb, (void *)(uintptr_t)UO_IO_ERR_NONE);
        uo_cb_stack_push(cb, 0);
        uo_cb_invoke_async(cb);
        return;
    }

    uo_ioop *ioop = malloc(sizeof *ioop);

    ioop->fd = wfd;
    ioop->buf = buf;
    ioop->len = len;
    ioop->cb = cb;

    #ifdef _WIN32

        bool success = QueueUserAPC(uo_io_queue_write, thrd, (ULONG_PTR)ioop);

    #else

        struct epoll_event *epevt = malloc(sizeof *epevt);
        epevt->events = EPOLLOUT | EPOLLONESHOT;
        epevt->data.ptr = ioop;
        uo_cb_stack_push(cb, epevt);

        bool success = (epoll_ctl(epfd, EPOLL_CTL_ADD, wfd, epevt) == 0)
            || (errno == EEXIST && epoll_ctl(epfd, EPOLL_CTL_MOD, wfd, epevt) == 0);

    #endif

    if (!success)
    {
        uo_cb_stack_push(cb, (void *)(uintptr_t)UO_IO_ERR_UNKNOWN);
        uo_cb_stack_push(cb, 0);
        uo_cb_invoke_async(cb);
    }
}